

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_edwards_get_affine(EdwardsPoint *ep,mp_int **x,mp_int **y)

{
  EdwardsCurve *pEVar1;
  mp_int *pmVar2;
  EdwardsCurve *ec;
  mp_int **y_local;
  mp_int **x_local;
  EdwardsPoint *ep_local;
  
  pEVar1 = ep->ec;
  ecc_edwards_normalise(ep);
  if (x != (mp_int **)0x0) {
    pmVar2 = monty_export(pEVar1->mc,ep->X);
    *x = pmVar2;
  }
  if (y != (mp_int **)0x0) {
    pmVar2 = monty_export(pEVar1->mc,ep->Y);
    *y = pmVar2;
  }
  return;
}

Assistant:

void ecc_edwards_get_affine(EdwardsPoint *ep, mp_int **x, mp_int **y)
{
    EdwardsCurve *ec = ep->ec;

    ecc_edwards_normalise(ep);

    if (x)
        *x = monty_export(ec->mc, ep->X);
    if (y)
        *y = monty_export(ec->mc, ep->Y);
}